

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O3

void __thiscall
GlobOpt::CSEAddInstr
          (GlobOpt *this,BasicBlock *block,Instr *instr,Value *dstVal,Value *src1Val,Value *src2Val,
          Value *dstIndirIndexVal,Value *src1IndirIndexVal)

{
  GlobOptBlockData *this_00;
  OpCode OVar1;
  ValueInfo *this_01;
  code *pcVar2;
  GlobOpt *pGVar3;
  bool bVar4;
  OpndKind OVar5;
  bool bVar6;
  BailOutKind BVar7;
  Value *pVVar8;
  undefined4 *puVar9;
  StackSym *pSVar10;
  Value **ppVVar11;
  RegOpnd *pRVar12;
  ulong uVar13;
  ExprAttributes exprAttributes;
  Opnd *pOVar14;
  int32 local_64;
  BasicBlock *pBStack_60;
  int32 intConstantValue;
  Value *local_58;
  Value *local_50;
  Value *local_48;
  GlobOpt *local_40;
  ExprHash local_34 [2];
  ExprHash hash;
  
  local_34[0] = (ExprHash)0x0;
  pBStack_60 = block;
  local_58 = src1Val;
  local_50 = dstVal;
  local_48 = src2Val;
  local_40 = this;
  bVar4 = DoCSE(this);
  if (!bVar4) {
    return;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 < Neg_I4) {
    if (OVar1 == LdElemI_A) {
LAB_0049702d:
      local_48 = src1IndirIndexVal;
      pOVar14 = instr->m_src1;
      OVar5 = IR::Opnd::GetKind(pOVar14);
      if (OVar5 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar4) goto LAB_0049743c;
LAB_00497093:
        *puVar9 = 0;
      }
    }
    else {
      if ((OVar1 != StElemI_A) && (exprAttributes.attributes = 0, OVar1 != StElemI_A_Strict))
      goto LAB_00496f0e;
      bVar4 = CanCSEArrayStore(this,instr);
      if (!bVar4) {
        return;
      }
      local_48 = dstIndirIndexVal;
      pOVar14 = instr->m_dst;
      OVar5 = IR::Opnd::GetKind(pOVar14);
      if (OVar5 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar4) goto LAB_0049743c;
        local_50 = local_58;
        goto LAB_00497093;
      }
      local_50 = local_58;
    }
    this_00 = &pBStack_60->globOptData;
    pVVar8 = GlobOptBlockData::FindValue(this_00,(Sym *)pOVar14[1]._vptr_Opnd[2]);
    if (local_48 == (Value *)0x0) {
      if (*(long *)&pOVar14[1].m_valueType == 0) {
        return;
      }
      local_48 = GlobOptBlockData::FindValue
                           (this_00,*(Sym **)(*(long *)&pOVar14[1].m_valueType + 0x10));
    }
    local_58 = pVVar8;
    bVar6 = ValueType::IsLikelyOptimizedVirtualTypedArray(&pVVar8->valueInfo->super_ValueType);
    bVar4 = true;
    exprAttributes.attributes = 0;
    if (bVar6) {
      bVar6 = (*(ushort *)&instr->field_0x36 >> 0xe & 1) == 0;
      exprAttributes.attributes = bVar6 + 2;
      if ((short)*(ushort *)&instr->field_0x36 < 0) {
        exprAttributes.attributes = (uint)bVar6;
      }
    }
  }
  else {
    uVar13 = (ulong)(OVar1 - 0x1be);
    if (OVar1 - 0x1be < 0x23) {
      if ((0x41edUL >> (uVar13 & 0x3f) & 1) == 0) {
        if ((0x600000000U >> (uVar13 & 0x3f) & 1) != 0) {
          bVar4 = IRType_IsUnsignedInt(instr->m_dst->m_type);
          bVar6 = IRType_IsUnsignedInt(instr->m_src1->m_type);
          exprAttributes.attributes = bVar4 + 2;
          if (!bVar6) {
            exprAttributes.attributes = (uint)bVar4;
          }
          goto LAB_00496f0e;
        }
        if (uVar13 != 4) goto LAB_00496ff0;
        if (((((instr->field_0x38 & 0x10) != 0) &&
             (BVar7 = IR::Instr::GetBailOutKind(instr), (BVar7 >> 0xb & 1) != 0)) &&
            (bVar4 = IR::Instr::ShouldCheckFor32BitOverflow(instr), !bVar4)) &&
           (instr->ignoreOverflowBitCount != '5')) {
          return;
        }
      }
      exprAttributes.attributes = *(uint *)&local_40->field_0xf4 >> 2 & 3;
    }
    else {
LAB_00496ff0:
      if ((OVar1 - 0x25e < 7) && ((0x43U >> (OVar1 - 0x25e & 0x1f) & 1) != 0)) {
        bVar6 = IR::Instr::ShouldCheckForNegativeZero(instr);
        exprAttributes.attributes = 0;
        bVar4 = false;
        if (!bVar6) {
          return;
        }
        goto LAB_00497111;
      }
      exprAttributes.attributes = 0;
      if (OVar1 == LdArrViewElem) goto LAB_0049702d;
    }
LAB_00496f0e:
    bVar4 = false;
  }
LAB_00497111:
  if (instr->m_dst == (Opnd *)0x0) {
    bVar6 = GetHash(local_40,instr,local_58,local_48,exprAttributes,local_34);
    if (!bVar6) {
      return;
    }
  }
  else {
    if (local_50 == (Value *)0x0) {
      return;
    }
    this_01 = local_50->valueInfo;
    if (this_01->symStore == (Sym *)0x0) {
      if (!bVar4) {
        return;
      }
      bVar6 = ValueInfo::HasIntConstantValue(this_01,false);
      if (!bVar6) {
        return;
      }
      bVar6 = ValueType::IsIntAndLikelyTagged(&this_01->super_ValueType);
      if (!bVar6) {
        return;
      }
      OVar5 = IR::Opnd::GetKind(instr->m_src1);
      if (OVar5 != OpndKindAddr) {
        return;
      }
    }
    bVar6 = GetHash(local_40,instr,local_58,local_48,exprAttributes,local_34);
    if (!bVar6) {
      return;
    }
    if ((this_01->symStore != (Sym *)0x0) ||
       (bVar6 = ValueInfo::TryGetIntConstantValue(this_01,&local_64,false), !bVar6))
    goto LAB_004972ff;
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                         ,0x137,"(isArray)","isArray");
      if (!bVar6) goto LAB_0049743c;
      *puVar9 = 0;
    }
    bVar6 = ValueType::IsIntAndLikelyTagged(&this_01->super_ValueType);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                         ,0x138,"(valueInfo->IsIntAndLikelyTagged())",
                         "valueInfo->IsIntAndLikelyTagged()");
      if (!bVar6) goto LAB_0049743c;
      *puVar9 = 0;
    }
    OVar5 = IR::Opnd::GetKind(instr->m_src1);
    if (OVar5 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                         ,0x139,"(instr->GetSrc1()->IsAddrOpnd())","instr->GetSrc1()->IsAddrOpnd()")
      ;
      if (!bVar6) {
LAB_0049743c:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
    pGVar3 = local_40;
    pSVar10 = GetOrCreateTaggedIntConstantStackSym(local_40,local_64);
    IR::Instr::HoistSrc1(instr,Ld_A,RegNOREG,pSVar10);
    GlobOptBlockData::SetValue(&pGVar3->currentBlock->globOptData,local_50,&pSVar10->super_Sym);
  }
LAB_004972ff:
  ppVVar11 = ValueHashTable<ExprHash,_Value_*>::FindOrInsertNew
                       ((pBStack_60->globOptData).exprToValueMap,local_34[0]);
  *ppVVar11 = local_50;
  if (bVar4) {
    BVSparse<Memory::JitArenaAllocator>::Set
              ((pBStack_60->globOptData).liveArrayValues,(BVIndex)local_34[0]);
  }
  bVar4 = MayNeedBailOnImplicitCall(instr,local_58,local_48);
  if (bVar4) {
    (local_40->currentBlock->globOptData).hasCSECandidates = true;
    pOVar14 = instr->m_src1;
    if (pOVar14 != (Opnd *)0x0) {
      OVar5 = IR::Opnd::GetKind(pOVar14);
      if (OVar5 == OpndKindReg) {
        pRVar12 = IR::Opnd::AsRegOpnd(pOVar14);
        pSVar10 = pRVar12->m_sym;
        if ((pSVar10->field_0x1a & 1) != 0) {
          pSVar10 = StackSym::GetVarEquivSym(pSVar10,local_40->func);
        }
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((pBStack_60->globOptData).liveFields,(pSVar10->super_Sym).m_id);
      }
      pOVar14 = instr->m_src2;
      if ((pOVar14 != (Opnd *)0x0) && (OVar5 = IR::Opnd::GetKind(pOVar14), OVar5 == OpndKindReg)) {
        pRVar12 = IR::Opnd::AsRegOpnd(pOVar14);
        pSVar10 = pRVar12->m_sym;
        if ((pSVar10->field_0x1a & 1) != 0) {
          pSVar10 = StackSym::GetVarEquivSym(pSVar10,local_40->func);
        }
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((pBStack_60->globOptData).liveFields,(pSVar10->super_Sym).m_id);
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::CSEAddInstr(
    BasicBlock *block,
    IR::Instr *instr,
    Value *dstVal,
    Value *src1Val,
    Value *src2Val,
    Value *dstIndirIndexVal,
    Value *src1IndirIndexVal)
{
    ExprAttributes exprAttributes;
    ExprHash hash;

    if (!this->DoCSE())
    {
        return;
    }

    bool isArray = false;

    switch(instr->m_opcode)
    {
    case Js::OpCode::LdElemI_A:
    case Js::OpCode::LdArrViewElem:
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
    {
        // For arrays, hash the value # of the baseOpnd and indexOpnd
        IR::IndirOpnd *arrayOpnd;
        Value *indirIndexVal;
        if (instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)
        {
            if (!this->CanCSEArrayStore(instr))
            {
                return;
            }
            dstVal = src1Val;
            arrayOpnd = instr->GetDst()->AsIndirOpnd();
            indirIndexVal = dstIndirIndexVal;
        }
        else
        {
            // all the LdElem and Ld*ArrViewElem
            arrayOpnd = instr->GetSrc1()->AsIndirOpnd();
            indirIndexVal = src1IndirIndexVal;
        }

        src1Val = block->globOptData.FindValue(arrayOpnd->GetBaseOpnd()->m_sym);
        if(indirIndexVal)
        {
            src2Val = indirIndexVal;
        }
        else if (arrayOpnd->GetIndexOpnd())
        {
            src2Val = block->globOptData.FindValue(arrayOpnd->GetIndexOpnd()->m_sym);
        }
        else
        {
            return;
        }
        isArray = true;

        // for typed array do not add instructions whose dst are guaranteed to be int or number
        // as we will try to eliminate bound check for these typed arrays
        if (src1Val->GetValueInfo()->IsLikelyOptimizedVirtualTypedArray())
        {
            exprAttributes = DstIsIntOrNumberAttributes(!instr->dstIsAlwaysConvertedToInt32, !instr->dstIsAlwaysConvertedToNumber);
        }
        break;
    }

    case Js::OpCode::Mul_I4:
        // If int32 overflow is ignored, we only add MULs with 53-bit overflow check to expr map
        if (instr->HasBailOutInfo() && (instr->GetBailOutKind() & IR::BailOutOnMulOverflow) &&
            !instr->ShouldCheckFor32BitOverflow() && instr->ignoreOverflowBitCount != 53)
        {
            return;
        }

        // fall-through

    case Js::OpCode::Neg_I4:
    case Js::OpCode::Add_I4:
    case Js::OpCode::Sub_I4:
    case Js::OpCode::DivU_I4:
    case Js::OpCode::Div_I4:
    case Js::OpCode::RemU_I4:
    case Js::OpCode::Rem_I4:
    case Js::OpCode::ShrU_I4:
    {
        // Can't CSE and Add where overflow doesn't matter (and no bailout) with one where it does matter... Record whether int
        // overflow or negative zero were ignored.
        exprAttributes = IntMathExprAttributes(ignoredIntOverflowForCurrentInstr, ignoredNegativeZeroForCurrentInstr);
        break;
    }

    case Js::OpCode::InlineMathFloor:
    case Js::OpCode::InlineMathCeil:
    case Js::OpCode::InlineMathRound:
        if (!instr->ShouldCheckForNegativeZero())
        {
            return;
        }
        break;

    case Js::OpCode::Conv_Prim:
    case Js::OpCode::Conv_Prim_Sat:
        exprAttributes = ConvAttributes(instr->GetDst()->IsUnsigned(), instr->GetSrc1()->IsUnsigned());
        break;
    }

    ValueInfo *valueInfo = NULL;

    if (instr->GetDst())
    {
        if (!dstVal)
        {
            return;
        }

        valueInfo = dstVal->GetValueInfo();
        if(valueInfo->GetSymStore() == NULL &&
            !(isArray && valueInfo->HasIntConstantValue() && valueInfo->IsIntAndLikelyTagged() && instr->GetSrc1()->IsAddrOpnd()))
        {
            return;
        }
    }

    if (!this->GetHash(instr, src1Val, src2Val, exprAttributes, &hash))
    {
        return;
    }

    int32 intConstantValue;
    if(valueInfo && !valueInfo->GetSymStore() && valueInfo->TryGetIntConstantValue(&intConstantValue))
    {
        Assert(isArray);
        Assert(valueInfo->IsIntAndLikelyTagged());
        Assert(instr->GetSrc1()->IsAddrOpnd());

        // We need a sym associated with a value in the expression value table. Hoist the address into a stack sym associated
        // with the int constant value.
        StackSym *const constStackSym = GetOrCreateTaggedIntConstantStackSym(intConstantValue);
        instr->HoistSrc1(Js::OpCode::Ld_A, RegNOREG, constStackSym);
        currentBlock->globOptData.SetValue(dstVal, constStackSym);
    }

    // We have a candidate.  Add it to the exprToValueMap.
    Value ** pVal = block->globOptData.exprToValueMap->FindOrInsertNew(hash);
    *pVal = dstVal;

    if (isArray)
    {
        block->globOptData.liveArrayValues->Set(hash);
    }

    if (MayNeedBailOnImplicitCall(instr, src1Val, src2Val))
    {
        this->currentBlock->globOptData.hasCSECandidates = true;

        // Use LiveFields to track is object.valueOf/toString could get overridden.
        IR::Opnd *src1 = instr->GetSrc1();
        if (src1)
        {
            if (src1->IsRegOpnd())
            {
                StackSym *varSym = src1->AsRegOpnd()->m_sym;

                if (varSym->IsTypeSpec())
                {
                    varSym = varSym->GetVarEquivSym(this->func);
                }
                block->globOptData.liveFields->Set(varSym->m_id);
            }
            IR::Opnd *src2 = instr->GetSrc2();
            if (src2 && src2->IsRegOpnd())
            {
                StackSym *varSym = src2->AsRegOpnd()->m_sym;

                if (varSym->IsTypeSpec())
                {
                    varSym = varSym->GetVarEquivSym(this->func);
                }
                block->globOptData.liveFields->Set(varSym->m_id);
            }
        }
    }
}